

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CTypeID cp_decl_constinit(CPState *cp,CType **ctp,CTypeID ctypeid)

{
  char cVar1;
  CTypeID CVar2;
  uint uVar3;
  anon_union_4_2_43a9a9ed_for_CPValue_0 local_78;
  CTypeID constid;
  CPValue k;
  CTSize size;
  CTInfo info;
  CType *ctt;
  CTypeID ctypeid_local;
  CType **ctp_local;
  CPState *cp_local;
  
  _size = cp->cts->tab + ctypeid;
  ctt._4_4_ = ctypeid;
  while (_size->info >> 0x1c == 8) {
    ctt._4_4_ = _size->info & 0xffff;
    _size = cp->cts->tab + ctt._4_4_;
  }
  k.id = _size->info;
  k.field_0 = (anon_union_4_2_43a9a9ed_for_CPValue_0)_size->size;
  if ((((k.id & 0xfc000000) == 0) && ((k.id & 0x2000000) != 0)) && (k.field_0.u32 < 5)) {
    cp_check(cp,0x3d);
    cp_expr_sub(cp,(CPValue *)&local_78,0);
    CVar2 = lj_ctype_new(cp->cts,ctp);
    (*ctp)->info = (ctt._4_4_ | 0x2000000) + 0xb0000000;
    cVar1 = (char)k.field_0.i32;
    uVar3 = local_78.u32 << (('\x04' - cVar1) * '\b' & 0x1fU);
    if ((k.id & 0x800000) == 0) {
      local_78.i32 = (int)uVar3 >> (('\x04' - cVar1) * '\b' & 0x1fU);
    }
    else {
      local_78.u32 = uVar3 >> (('\x04' - cVar1) * '\b' & 0x1fU);
    }
    (*ctp)->size = (CTSize)local_78;
    return CVar2;
  }
  cp_err(cp,LJ_ERR_FFI_INVTYPE);
}

Assistant:

static CTypeID cp_decl_constinit(CPState *cp, CType **ctp, CTypeID ctypeid)
{
  CType *ctt = ctype_get(cp->cts, ctypeid);
  CTInfo info;
  CTSize size;
  CPValue k;
  CTypeID constid;
  while (ctype_isattrib(ctt->info)) {  /* Skip attributes. */
    ctypeid = ctype_cid(ctt->info);  /* Update ID, too. */
    ctt = ctype_get(cp->cts, ctypeid);
  }
  info = ctt->info;
  size = ctt->size;
  if (!ctype_isinteger(info) || !(info & CTF_CONST) || size > 4)
    cp_err(cp, LJ_ERR_FFI_INVTYPE);
  cp_check(cp, '=');
  cp_expr_sub(cp, &k, 0);
  constid = lj_ctype_new(cp->cts, ctp);
  (*ctp)->info = CTINFO(CT_CONSTVAL, CTF_CONST|ctypeid);
  k.u32 <<= 8*(4-size);
  if ((info & CTF_UNSIGNED))
    k.u32 >>= 8*(4-size);
  else
    k.u32 = (uint32_t)((int32_t)k.u32 >> 8*(4-size));
  (*ctp)->size = k.u32;
  return constid;
}